

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall
summarycalc::outputsummaryset(summarycalc *this,int sample_size,int summary_set,int event_id)

{
  int iVar1;
  OASIS_FLOAT **ppOVar2;
  OASIS_FLOAT *pOVar3;
  undefined4 local_5c;
  undefined4 local_58;
  sampleslevelRec s;
  sampleslevelRec s_1;
  int j;
  summarySampleslevelHeader sh;
  int i;
  int minsummaryids;
  int maxsummaryids;
  OASIS_FLOAT *se;
  OASIS_FLOAT **ssl;
  int event_id_local;
  int summary_set_local;
  int sample_size_local;
  summarycalc *this_local;
  
  ppOVar2 = this->sssl[summary_set];
  pOVar3 = this->sse[summary_set];
  iVar1 = this->max_summary_id_[summary_set];
  for (sh.summary_id = this->min_summary_id_[summary_set]; sh.summary_id <= iVar1;
      sh.summary_id = sh.summary_id + 1) {
    if ((0.0 < pOVar3[sh.summary_id]) || ((this->zerooutput_ & 1U) == 1)) {
      s_1.loss = (OASIS_FLOAT)event_id;
      if (this->idxout[summary_set] != (FILE *)0x0) {
        fprintf((FILE *)this->idxout[summary_set],"%d,%lld\n",(ulong)(uint)sh.summary_id,
                this->offset_[summary_set]);
      }
      fwrite(&s_1.loss,0xc,1,(FILE *)this->fout[summary_set]);
      this->offset_[summary_set] = this->offset_[summary_set] + 0xc;
      for (s_1.sidx = this->first_idx_; s_1.sidx < sample_size + this->num_idx_ + 1;
          s_1.sidx = s_1.sidx + 1) {
        if ((((s_1.sidx != this->num_idx_) && (s_1.sidx != this->num_idx_ + -4)) &&
            (s.sidx = s_1.sidx - this->num_idx_, s.sidx != -3)) && (s.sidx != -2)) {
          s.loss = ppOVar2[sh.summary_id][s_1.sidx];
          if ((this->zerooutput_ & 1U) == 0) {
            if ((0.0 < s.loss) || (s.sidx == -1)) {
              fwrite(&s,8,1,(FILE *)this->fout[summary_set]);
              this->offset_[summary_set] = this->offset_[summary_set] + 8;
            }
          }
          else {
            fwrite(&s,8,1,(FILE *)this->fout[summary_set]);
            this->offset_[summary_set] = this->offset_[summary_set] + 8;
          }
        }
      }
      local_5c = 0;
      local_58 = 0;
      fwrite(&local_5c,8,1,(FILE *)this->fout[summary_set]);
      this->offset_[summary_set] = this->offset_[summary_set] + 8;
    }
  }
  return;
}

Assistant:

void summarycalc::outputsummaryset(int sample_size, int summary_set, int event_id)
{
	OASIS_FLOAT **ssl = sssl[summary_set]; // OASIS_FLOAT **ssl two dimensional array of ssl[summary_id][sidx] to loss
	OASIS_FLOAT *se = sse[summary_set];
	int maxsummaryids = max_summary_id_[summary_set];
	int minsummaryids = min_summary_id_[summary_set];
	for (int i = minsummaryids ; i <= maxsummaryids; i++) {
		summarySampleslevelHeader sh;
		sh.event_id = event_id;
		sh.summary_id = i;
		sh.expval = se[i];
		if (sh.expval > 0 || zerooutput_ == true) {
			if (idxout[summary_set] != nullptr) {   // Fill index file
				fprintf(idxout[summary_set], "%d,%lld\n", i, offset_[summary_set]);
			}
			fwrite(&sh, sizeof(sh), 1, fout[summary_set]);
			offset_[summary_set] += sizeof(sh);
			for (int j = first_idx_; j < sample_size + num_idx_ + 1; j++) {
				if (j != num_idx_ && j != number_of_affected_risk_idx + num_idx_) {   // sidx = 0 AND sidx = number_of_affected_risk_idx
					sampleslevelRec s;
					s.sidx = j - num_idx_;
					if (s.sidx == tiv_idx || s.sidx == std_dev_idx) {
						// skip
					}
					else {
						s.loss = ssl[i][j];
						if (zerooutput_ == false) {
							if (s.loss > 0.0 || s.sidx == mean_idx) {
								fwrite(&s, sizeof(s), 1, fout[summary_set]);
								offset_[summary_set] += sizeof(s);
							}
						}
						else {
							fwrite(&s, sizeof(s), 1, fout[summary_set]);
							offset_[summary_set] += sizeof(s);
						}

					}
				}
			}
			sampleslevelRec s;
			s.sidx = 0;
			s.loss = 0.0;
			fwrite(&s, sizeof(s), 1, fout[summary_set]);
			offset_[summary_set] += sizeof(s);
		}
	}
}